

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

bool __thiscall tcmalloc::PageHeap::GetNextRange(PageHeap *this,PageID start,MallocRange *r)

{
  size_t sVar1;
  byte bVar2;
  int32_t iVar3;
  long *plVar4;
  SizeMap *this_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  size_t osize;
  Span *span;
  MallocRange *r_local;
  PageID start_local;
  PageHeap *this_local;
  
  plVar4 = (long *)TCMalloc_PageMap2<35>::Next(&this->pagemap_,start);
  if (plVar4 == (long *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    r->address = *plVar4 << 0xd;
    r->length = plVar4[1] << 0xd;
    r->fraction = 0.0;
    bVar2 = *(byte *)((long)plVar4 + 0x2b) & 3;
    if ((*(byte *)((long)plVar4 + 0x2b) & 3) == 0) {
      r->type = INUSE;
      r->fraction = 1.0;
      if ((*(uint *)(plVar4 + 5) >> 0x10 & 0xff) != 0) {
        this_00 = Static::sizemap();
        iVar3 = SizeMap::class_to_size(this_00,(uint)*(byte *)((long)plVar4 + 0x2a));
        auVar5._8_4_ = iVar3 >> 0x1f;
        auVar5._0_8_ = (long)iVar3;
        auVar5._12_4_ = 0x45300000;
        sVar1 = r->length;
        auVar6._8_4_ = (int)(sVar1 >> 0x20);
        auVar6._0_8_ = sVar1;
        auVar6._12_4_ = 0x45300000;
        r->fraction = (((auVar5._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0)) *
                      (double)*(ushort *)(plVar4 + 5)) /
                      ((auVar6._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
      }
    }
    else if (bVar2 == 1) {
      r->type = FREE;
    }
    else if (bVar2 == 2) {
      r->type = UNMAPPED;
    }
    else {
      r->type = UNKNOWN;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool PageHeap::GetNextRange(PageID start, base::MallocRange* r) {
  ASSERT(lock_.IsHeld());
  Span* span = reinterpret_cast<Span*>(pagemap_.Next(start));
  if (span == nullptr) {
    return false;
  }
  r->address = span->start << kPageShift;
  r->length = span->length << kPageShift;
  r->fraction = 0;
  switch (span->location) {
    case Span::IN_USE:
      r->type = base::MallocRange::INUSE;
      r->fraction = 1;
      if (span->sizeclass > 0) {
        // Only some of the objects in this span may be in use.
        const size_t osize = Static::sizemap()->class_to_size(span->sizeclass);
        r->fraction = (1.0 * osize * span->refcount) / r->length;
      }
      break;
    case Span::ON_NORMAL_FREELIST:
      r->type = base::MallocRange::FREE;
      break;
    case Span::ON_RETURNED_FREELIST:
      r->type = base::MallocRange::UNMAPPED;
      break;
    default:
      r->type = base::MallocRange::UNKNOWN;
      break;
  }
  return true;
}